

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

int __thiscall QDockAreaLayoutInfo::tabIndexToListIndex(QDockAreaLayoutInfo *this,int tabIndex)

{
  long *plVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  int iVar4;
  int i;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QTabBar::tabData(&local_50,this->tabBar,tabIndex);
  uVar2 = qvariant_cast<unsigned_long_long>(&local_50);
  ::QVariant::~QVariant(&local_50);
  lVar6 = 0;
  iVar4 = -1;
  uVar5 = 0;
  do {
    if ((ulong)(this->item_list).d.size <= uVar5) {
LAB_003ccec6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return iVar4;
      }
      __stack_chk_fail();
    }
    plVar1 = *(long **)((long)&((this->item_list).d.ptr)->widgetItem + lVar6);
    if (plVar1 == (long *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*plVar1 + 0x68))();
    }
    if (uVar3 == uVar2) {
      iVar4 = (int)uVar5;
      goto LAB_003ccec6;
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x28;
  } while( true );
}

Assistant:

int QDockAreaLayoutInfo::tabIndexToListIndex(int tabIndex) const
{
    Q_ASSERT(tabbed && tabBar);
    quintptr data = qvariant_cast<quintptr>(tabBar->tabData(tabIndex));
    for (int i = 0; i < item_list.size(); ++i) {
        if (tabId(item_list.at(i)) == data)
            return i;
    }
    return -1;
}